

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::fix_up_interpolant_access_chain
          (CompilerMSL *this,uint32_t *ops,uint32_t length)

{
  ConstantMatrix *pCVar1;
  uint32_t *puVar2;
  uint32_t uVar3;
  uint32_t index;
  uint uVar4;
  size_type sVar5;
  size_t sVar6;
  CompilerError *this_00;
  TypedID *this_01;
  bool bVar7;
  allocator local_81;
  string local_80 [32];
  SPIRConstant *local_60;
  SPIRConstant *c_1;
  SPIRConstant *pSStack_50;
  uint32_t i;
  SPIRConstant *c;
  SPIRType *type;
  SPIRType *result_type;
  SPIRType *var_type;
  uint32_t interface_index;
  SPIRVariable *var;
  uint32_t *puStack_18;
  uint32_t length_local;
  uint32_t *ops_local;
  CompilerMSL *this_local;
  
  var._4_4_ = length;
  puStack_18 = ops;
  ops_local = (uint32_t *)this;
  _interface_index = Compiler::maybe_get_backing_variable((Compiler *)this,ops[2]);
  bVar7 = true;
  if (_interface_index != (SPIRVariable *)0x0) {
    var_type._4_4_ =
         TypedID::operator_cast_to_unsigned_int((TypedID *)&(_interface_index->super_IVariant).self)
    ;
    sVar5 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->pull_model_inputs,(key_type *)((long)&var_type + 4));
    bVar7 = sVar5 == 0;
  }
  if (!bVar7) {
    result_type = Compiler::get_variable_data_type((Compiler *)this,_interface_index);
    type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,*puStack_18);
    c = (SPIRConstant *)result_type;
    bVar7 = Compiler::has_extended_decoration
                      ((Compiler *)this,puStack_18[2],SPIRVCrossDecorationInterfaceMemberIndex);
    puVar2 = puStack_18;
    if (bVar7) {
      var_type._0_4_ =
           Compiler::get_extended_decoration
                     ((Compiler *)this,puStack_18[2],SPIRVCrossDecorationInterfaceMemberIndex);
    }
    else {
      if (*(int *)&(result_type->super_IVariant).field_0xc != 0xf) {
        __assert_fail("var_type.basetype == SPIRType::Struct",
                      "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x2050,
                      "void spirv_cross::CompilerMSL::fix_up_interpolant_access_chain(const uint32_t *, uint32_t)"
                     );
      }
      sVar6 = VectorView<unsigned_int>::size(&(result_type->array).super_VectorView<unsigned_int>);
      pSStack_50 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,puVar2[sVar6 + 3]);
      uVar3 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(_interface_index->super_IVariant).self);
      index = SPIRConstant::scalar(pSStack_50,0,0);
      var_type._0_4_ =
           Compiler::get_extended_member_decoration
                     ((Compiler *)this,uVar3,index,SPIRVCrossDecorationInterfaceMemberIndex);
    }
    for (c_1._4_4_ = 3; c_1._4_4_ < var._4_4_; c_1._4_4_ = c_1._4_4_ + 1) {
      bVar7 = Compiler::is_vector((Compiler *)this,(SPIRType *)c);
      if (((bVar7) && (bVar7 = Compiler::is_array((Compiler *)this,(SPIRType *)c), !bVar7)) &&
         (bVar7 = Compiler::is_scalar((Compiler *)this,type), bVar7)) {
        Compiler::set_extended_decoration
                  ((Compiler *)this,puStack_18[1],SPIRVCrossDecorationInterpolantComponentExpr,
                   puStack_18[c_1._4_4_]);
        break;
      }
      local_60 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                           ((Compiler *)this,puStack_18[c_1._4_4_]);
      if ((local_60 == (SPIRConstant *)0x0) || ((local_60->specialization & 1U) != 0)) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_80,
                   "Trying to dynamically index into an array interface variable using pull-model interpolation. This is currently unsupported."
                   ,&local_81);
        CompilerError::CompilerError(this_00,(string *)local_80);
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      uVar3 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)
                         ((long)&(c->subconstants).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                         + 4));
      if (uVar3 == 0) {
        if (*(int *)&(c->super_IVariant).field_0xc == 0xf) {
          pCVar1 = &c->m;
          uVar3 = SPIRConstant::scalar(local_60,0,0);
          this_01 = (TypedID *)
                    VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                               (pCVar1->c[2].r + 1),(ulong)uVar3);
          uVar3 = TypedID::operator_cast_to_unsigned_int(this_01);
          c = (SPIRConstant *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
        }
      }
      else {
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)
                           ((long)&(c->subconstants).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
                                   ptr + 4));
        c = (SPIRConstant *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
      }
      bVar7 = Compiler::has_extended_decoration
                        ((Compiler *)this,puStack_18[2],SPIRVCrossDecorationInterfaceMemberIndex);
      if ((bVar7) ||
         (uVar4 = c_1._4_4_ - 3,
         sVar6 = VectorView<unsigned_int>::size
                           (&(result_type->array).super_VectorView<unsigned_int>), uVar4 != sVar6))
      {
        uVar3 = SPIRConstant::scalar(local_60,0,0);
        var_type._0_4_ = uVar3 + (uint32_t)var_type;
      }
    }
    Compiler::set_extended_decoration
              ((Compiler *)this,puStack_18[1],SPIRVCrossDecorationInterfaceMemberIndex,
               (uint32_t)var_type);
  }
  return;
}

Assistant:

void CompilerMSL::fix_up_interpolant_access_chain(const uint32_t *ops, uint32_t length)
{
	auto *var = maybe_get_backing_variable(ops[2]);
	if (!var || !pull_model_inputs.count(var->self))
		return;
	// Get the base index.
	uint32_t interface_index;
	auto &var_type = get_variable_data_type(*var);
	auto &result_type = get<SPIRType>(ops[0]);
	auto *type = &var_type;
	if (has_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex))
	{
		interface_index = get_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex);
	}
	else
	{
		// Assume an access chain into a struct variable.
		assert(var_type.basetype == SPIRType::Struct);
		auto &c = get<SPIRConstant>(ops[3 + var_type.array.size()]);
		interface_index =
		    get_extended_member_decoration(var->self, c.scalar(), SPIRVCrossDecorationInterfaceMemberIndex);
	}
	// Accumulate indices. We'll have to skip over the one for the struct, if present, because we already accounted
	// for that getting the base index.
	for (uint32_t i = 3; i < length; ++i)
	{
		if (is_vector(*type) && !is_array(*type) && is_scalar(result_type))
		{
			// We don't want to combine the next index. Actually, we need to save it
			// so we know to apply a swizzle to the result of the interpolation.
			set_extended_decoration(ops[1], SPIRVCrossDecorationInterpolantComponentExpr, ops[i]);
			break;
		}

		auto *c = maybe_get<SPIRConstant>(ops[i]);
		if (!c || c->specialization)
			SPIRV_CROSS_THROW("Trying to dynamically index into an array interface variable using pull-model "
			                  "interpolation. This is currently unsupported.");

		if (type->parent_type)
			type = &get<SPIRType>(type->parent_type);
		else if (type->basetype == SPIRType::Struct)
			type = &get<SPIRType>(type->member_types[c->scalar()]);

		if (!has_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex) &&
		    i - 3 == var_type.array.size())
			continue;

		interface_index += c->scalar();
	}
	// Save this to the access chain itself so we can recover it later when calling an interpolation function.
	set_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex, interface_index);
}